

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::InitToCellUnionBorder(S2Polygon *this,S2CellUnion *cells)

{
  bool bVar1;
  int iVar2;
  reference pSVar3;
  ostream *poVar4;
  uint64 uVar5;
  double dVar6;
  S2LogMessage local_408;
  S2LogMessageVoidify local_3f5;
  undefined4 local_3f4;
  S2LogMessage local_3f0;
  undefined1 local_3e0 [8];
  S2Error error;
  S2Cell local_3b0;
  S2Loop local_378;
  uint64 local_2b0;
  S2CellId id;
  const_iterator __end1;
  const_iterator __begin1;
  S2CellUnion *__range1;
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>
  local_288;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_280 [3];
  double local_268;
  IdentitySnapFunction local_260;
  Options local_250;
  undefined1 local_240 [8];
  S2Builder builder;
  double snap_radius;
  S2CellUnion *cells_local;
  S2Polygon *this_local;
  
  dVar6 = S2::Metric<1>::GetValue((Metric<1> *)&S2::kMinWidth,0x1e);
  builder.edge_sites_.
  super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar6 * 0.5);
  local_268 = (double)S1Angle::Radians((double)builder.edge_sites_.
                                               super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  s2builderutil::IdentitySnapFunction::IdentitySnapFunction(&local_260,(S1Angle)local_268);
  S2Builder::Options::Options(&local_250,&local_260.super_SnapFunction);
  S2Builder::S2Builder((S2Builder *)local_240,&local_250);
  S2Builder::Options::~Options(&local_250);
  s2builderutil::IdentitySnapFunction::~IdentitySnapFunction(&local_260);
  __range1 = (S2CellUnion *)this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>
            ((absl *)&local_288,(S2Polygon **)&__range1);
  std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>::
  unique_ptr<s2builderutil::S2PolygonLayer,std::default_delete<s2builderutil::S2PolygonLayer>,void>
            ((unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>> *)local_280,
             &local_288);
  S2Builder::StartLayer((S2Builder *)local_240,local_280);
  std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::~unique_ptr(local_280);
  std::
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>::
  ~unique_ptr(&local_288);
  __end1 = S2CellUnion::begin(cells);
  id.id_ = (uint64)S2CellUnion::end(cells);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                     *)&id), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
             ::operator*(&__end1);
    error._32_8_ = pSVar3->id_;
    local_2b0 = error._32_8_;
    S2Cell::S2Cell(&local_3b0,(S2CellId)error._32_8_);
    S2Loop::S2Loop(&local_378,&local_3b0);
    S2Builder::AddLoop((S2Builder *)local_240,&local_378);
    S2Loop::~S2Loop(&local_378);
    S2Cell::~S2Cell(&local_3b0);
    __gnu_cxx::
    __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&__end1);
  }
  S2Error::S2Error((S2Error *)local_3e0);
  bVar1 = S2Builder::Build((S2Builder *)local_240,(S2Error *)local_3e0);
  if (!bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_3f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
               ,0x513,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_3f0);
    poVar4 = std::operator<<(poVar4,"InitToCellUnionBorder failed: ");
    ::operator<<(poVar4,(S2Error *)local_3e0);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_3f0);
  }
  iVar2 = num_loops(this);
  if (iVar2 == 0) {
    bVar1 = S2CellUnion::empty(cells);
    if (bVar1) {
      local_3f4 = 1;
      goto LAB_004bdb8c;
    }
    uVar5 = S2CellUnion::LeafCellsCovered(cells);
    if (uVar5 != 0x6000000000000000) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_408,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                 ,0x51b,kFatal,(ostream *)&std::cerr);
      poVar4 = S2LogMessage::stream(&local_408);
      poVar4 = std::operator<<(poVar4,
                               "Check failed: (uint64{6} << (2 * S2CellId::kMaxLevel)) == (cells.LeafCellsCovered()) "
                              );
      S2LogMessageVoidify::operator&(&local_3f5,poVar4);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_408);
    }
    Invert(this);
  }
  local_3f4 = 0;
LAB_004bdb8c:
  S2Error::~S2Error((S2Error *)local_3e0);
  S2Builder::~S2Builder((S2Builder *)local_240);
  return;
}

Assistant:

void S2Polygon::InitToCellUnionBorder(const S2CellUnion& cells) {
  // We use S2Builder to compute the union.  Due to rounding errors, we can't
  // compute an exact union - when a small cell is adjacent to a larger cell,
  // the shared edges can fail to line up exactly.  Two cell edges cannot come
  // closer then kMinWidth, so if we have S2Builder snap edges within half
  // that distance, then we should always merge shared edges without merging
  // different edges.
  double snap_radius = 0.5 * S2::kMinWidth.GetValue(S2CellId::kMaxLevel);
  S2Builder builder{S2Builder::Options(
      IdentitySnapFunction(S1Angle::Radians(snap_radius)))};
  builder.StartLayer(make_unique<S2PolygonLayer>(this));
  for (S2CellId id : cells) {
    builder.AddLoop(S2Loop{S2Cell{id}});
  }
  S2Error error;
  if (!builder.Build(&error)) {
    S2_LOG(DFATAL) << "InitToCellUnionBorder failed: " << error;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  There are only two ways that this can
  // happen: either the cell union is empty, or it consists of all six faces.
  if (num_loops() == 0) {
    if (cells.empty()) return;
    S2_DCHECK_EQ(uint64{6} << (2 * S2CellId::kMaxLevel),
              cells.LeafCellsCovered());
    Invert();
  }
}